

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cirs2icrs.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  double jd;
  CESkyCoord output;
  CESkyCoord input;
  CEExecOptions opts;
  string local_3e0;
  CESkyCoordType local_3bc;
  CEAngle local_3b8 [48];
  string local_388 [2];
  double local_348;
  double local_340;
  CESkyCoord local_338 [48];
  string local_308 [5];
  CEExecOptions local_258;
  
  DefineOpts();
  bVar2 = CLOptions::ParseCommandLine(&local_258.super_CLOptions,argc,argv);
  if (!bVar2) {
    paVar1 = &local_308[0].field_2;
    local_308[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"ra","");
    local_340 = CLOptions::AsDouble(&local_258.super_CLOptions,local_308);
    CEAngle::Deg((double *)local_3b8);
    local_388[0]._M_dataplus._M_p = (pointer)&local_388[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"dec","");
    local_348 = CLOptions::AsDouble(&local_258.super_CLOptions,local_388);
    CEAngle::Deg((double *)&local_3e0);
    local_3bc = CIRS;
    CESkyCoord::CESkyCoord(local_338,local_3b8,(CEAngle *)&local_3e0,&local_3bc);
    CEAngle::~CEAngle((CEAngle *)&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388[0]._M_dataplus._M_p != &local_388[0].field_2) {
      operator_delete(local_388[0]._M_dataplus._M_p);
    }
    CEAngle::~CEAngle(local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_308[0]._M_dataplus._M_p);
    }
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"juliandate","");
    CLOptions::AsDouble(&local_258.super_CLOptions,&local_3e0);
    CEDate::CEDate((CEDate *)local_388,0);
    CEObserver::CEObserver((CEObserver *)local_308);
    CESkyCoord::ConvertToICRS((CEDate *)local_3b8,(CEObserver *)local_338);
    CEObserver::~CEObserver((CEObserver *)local_308);
    CEDate::~CEDate((CEDate *)local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p);
    }
    local_308[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"juliandate","");
    jd = CLOptions::AsDouble(&local_258.super_CLOptions,local_308);
    PrintResults(local_338,(CESkyCoord *)local_3b8,jd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_308[0]._M_dataplus._M_p);
    }
    CESkyCoord::~CESkyCoord((CESkyCoord *)local_3b8);
    CESkyCoord::~CESkyCoord(local_338);
  }
  CEExecOptions::~CEExecOptions(&local_258);
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
    // Get the options from the command line
    CEExecOptions opts = DefineOpts() ;
    if (opts.ParseCommandLine(argc, argv)) return 0 ;
    
    // Create a CECoordinates object
    CESkyCoord input(CEAngle::Deg(opts.AsDouble("ra")), 
                     CEAngle::Deg(opts.AsDouble("dec")),
                     CESkyCoordType::CIRS) ;
    
    // Get the coordinates as CIRS
    CESkyCoord output = input.ConvertToICRS(opts.AsDouble("juliandate")) ;
    
    // Print the result
    PrintResults(input, output, opts.AsDouble("juliandate")) ;
}